

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_clear(HSQUIRRELVM v,SQInteger idx)

{
  int iVar1;
  HSQUIRRELVM v_00;
  SQRESULT SVar2;
  SQObject *o;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  
  v_00 = (HSQUIRRELVM)
         stack_get(in_stack_ffffffffffffffe0,
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar1 = *(int *)&(v_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted;
  if (iVar1 == 0x8000040) {
    SQArray::Resize((SQArray *)idx,(SQInteger)o);
  }
  else {
    if (iVar1 != 0xa000020) {
      SVar2 = sq_throwerror(v_00,(SQChar *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
      return SVar2;
    }
    SQTable::Clear((SQTable *)v_00);
  }
  return 0;
}

Assistant:

SQRESULT sq_clear(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    switch(sq_type(o)) {
        case OT_TABLE: _table(o)->Clear();  break;
        case OT_ARRAY: _array(o)->Resize(0); break;
        default:
            return sq_throwerror(v, _SC("clear only works on table and array"));
        break;

    }
    return SQ_OK;
}